

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.cpp
# Opt level: O0

void __thiscall
TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_>::Write
          (TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_> *this,TPZStream *buf,
          int withclassid)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  TPZDohrSubstructCondense<float> *pTVar3;
  long *in_RSI;
  list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
  *in_RDI;
  int classid;
  const_iterator it;
  int size;
  list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  TPZBaseMatrix *in_stack_ffffffffffffffd0;
  _Self local_28;
  _Self local_20;
  undefined4 local_18 [2];
  long *local_10;
  
  local_10 = in_RSI;
  TPZBaseMatrix::Write
            (in_stack_ffffffffffffffd0,
             (TPZStream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (int)((ulong)in_RDI >> 0x20));
  TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
            ((TPZAutoPointer<TPZDohrAssembly<float>_> *)
             &in_RDI[2].
              super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
              ._M_impl._M_node._M_size);
  TPZPersistenceManager::WritePointer((TPZSavable *)in_RDI,(TPZStream *)in_stack_ffffffffffffffb8);
  (**(code **)(*local_10 + 0x18))
            (local_10,&in_RDI[2].
                       super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_prev,1);
  (**(code **)(*local_10 + 0x18))
            (local_10,(undefined1 *)
                      ((long)&in_RDI[2].
                              super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                              ._M_impl._M_node.super__List_node_base._M_prev + 4),1);
  sVar2 = std::__cxx11::
          list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
          ::size(in_RDI);
  local_18[0] = (undefined4)sVar2;
  (**(code **)(*local_10 + 0x18))(local_10,local_18,1);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this_00 = std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::
              operator*((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> *)
                        in_RDI);
    pTVar3 = TPZAutoPointer<TPZDohrSubstructCondense<float>_>::operator->(this_00);
    (*(pTVar3->super_TPZSavable)._vptr_TPZSavable[5])(pTVar3,local_10,0);
    std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::operator++
              (&local_20,0);
  }
  local_18[0] = 0;
  (*(code *)(in_RDI->
            super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
            )._M_impl._M_node.super__List_node_base._M_next[2]._M_next)();
  (**(code **)(*local_10 + 0x18))(local_10,&stack0xffffffffffffffcc,1);
  return;
}

Assistant:

void TPZDohrMatrix<TVar,TSubStruct >::Write( TPZStream &buf, int withclassid ) const
{
    SAVEABLE_STR_NOTE(buf,"TPZMatrix<TVar>::Write ()");
    TPZMatrix<TVar>::Write(buf, withclassid);
    SAVEABLE_STR_NOTE(buf,"fAssembly->Write");
    TPZPersistenceManager::WritePointer(fAssembly.operator ->(), &buf);
    SAVEABLE_STR_NOTE(buf,"fNumCoarse");
    buf.Write(&fNumCoarse);
    SAVEABLE_STR_NOTE(buf,"fNumThreads");
    buf.Write(&fNumThreads);
    int size = fGlobal.size();
    SAVEABLE_STR_NOTE(buf,"fGlobal.size()");
    buf.Write(&size);
    for (auto it=fGlobal.begin(); it != fGlobal.end(); it++) {
        SAVEABLE_STR_NOTE(buf,"fGlobal[...]");
        (*it)->Write(buf,0);
    }
    size = 0;
    int classid = ClassId();
    SAVEABLE_STR_NOTE(buf,"ClassId");
    buf.Write(&classid );
}